

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.h
# Opt level: O0

void __thiscall
google::protobuf::internal::RepeatedFieldAccessor::Add<double,double>
          (RepeatedFieldAccessor *this,Field *data,double *value)

{
  double local_28;
  ActualType tmp;
  double *value_local;
  Field *data_local;
  RepeatedFieldAccessor *this_local;
  
  local_28 = *value;
  tmp = (ActualType)value;
  value_local = (double *)data;
  data_local = this;
  (**(code **)(*(long *)this + 0x28))(this,data,&local_28);
  return;
}

Assistant:

void Add(Field* PROTOBUF_NONNULL data, const ValueType& value) const {
    typedef typename RefTypeTraits<T>::AccessorValueType ActualType;
    // In this RepeatedFieldAccessor interface we pass/return data using
    // raw pointers. Type of the data these raw pointers point to should
    // be ActualType. Here we have a ValueType object and want a ActualType
    // pointer. We can't cast a ValueType pointer to an ActualType pointer
    // directly because their type might be different (for enums ValueType
    // may be a generated enum type while ActualType is int32_t). To be safe
    // we make a copy to get a temporary ActualType object and use it.
    ActualType tmp = static_cast<ActualType>(value);
    Add(data, static_cast<const Value*>(&tmp));
  }